

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_copy.cpp
# Opt level: O2

unique_ptr<duckdb::CopyStatement,_std::default_delete<duckdb::CopyStatement>,_true> __thiscall
duckdb::Transformer::TransformCopy(Transformer *this,PGCopyStmt *stmt)

{
  string *table_name;
  _Head_base<0UL,_duckdb::QueryNode_*,_false> _Var1;
  optional_ptr<duckdb_libpgquery::PGResTarget,_true> oVar2;
  bool bVar3;
  pointer pCVar4;
  type info;
  PGResTarget *pPVar5;
  pointer this_00;
  long in_RDX;
  undefined8 *puVar6;
  long lVar7;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  allocator_type local_b4;
  allocator local_b3;
  allocator_type local_b2;
  allocator local_b1;
  __uniq_ptr_impl<duckdb::CopyStatement,_std::default_delete<duckdb::CopyStatement>_> local_b0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_a8;
  optional_ptr<duckdb_libpgquery::PGResTarget,_true> target;
  string local_70 [32];
  string local_50 [32];
  
  make_uniq<duckdb::CopyStatement>();
  local_b0._M_t.
  super__Tuple_impl<0UL,_duckdb::CopyStatement_*,_std::default_delete<duckdb::CopyStatement>_>.
  super__Head_base<0UL,_duckdb::CopyStatement_*,_false>._M_head_impl =
       (tuple<duckdb::CopyStatement_*,_std::default_delete<duckdb::CopyStatement>_>)
       (tuple<duckdb::CopyStatement_*,_std::default_delete<duckdb::CopyStatement>_>)this;
  pCVar4 = unique_ptr<duckdb::CopyStatement,_std::default_delete<duckdb::CopyStatement>,_true>::
           operator->((unique_ptr<duckdb::CopyStatement,_std::default_delete<duckdb::CopyStatement>,_true>
                       *)this);
  info = unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>::operator*
                   (&pCVar4->info);
  info->is_from = *(bool *)(in_RDX + 0x20);
  table_name = &info->file_path;
  ::std::__cxx11::string::assign((char *)table_name);
  ::std::__cxx11::string::string((string *)&target,"parquet",&local_b3);
  __l._M_len = 1;
  __l._M_array = (iterator)&target;
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&local_a8,__l,&local_b4);
  bVar3 = ReplacementScan::CanReplace(table_name,&local_a8);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_a8);
  ::std::__cxx11::string::~string((string *)&target);
  if (!bVar3) {
    ::std::__cxx11::string::string((string *)&target,"json",&local_b3);
    ::std::__cxx11::string::string(local_70,"jsonl",(allocator *)&local_b4);
    ::std::__cxx11::string::string(local_50,"ndjson",&local_b1);
    __l_00._M_len = 3;
    __l_00._M_array = (iterator)&target;
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_a8,__l_00,&local_b2);
    ReplacementScan::CanReplace(table_name,&local_a8);
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_a8);
    lVar7 = 0x40;
    do {
      ::std::__cxx11::string::~string((string *)((long)&target.ptr + lVar7));
      lVar7 = lVar7 + -0x20;
    } while (lVar7 != -0x20);
  }
  ::std::__cxx11::string::assign((char *)&info->format);
  puVar6 = *(undefined8 **)(in_RDX + 0x18);
  if (puVar6 != (undefined8 *)0x0) {
    while (puVar6 = (undefined8 *)puVar6[1], puVar6 != (undefined8 *)0x0) {
      target.ptr = (PGResTarget *)*puVar6;
      pPVar5 = optional_ptr<duckdb_libpgquery::PGResTarget,_true>::operator->(&target);
      if (pPVar5->name != (char *)0x0) {
        pPVar5 = optional_ptr<duckdb_libpgquery::PGResTarget,_true>::operator->(&target);
        ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char*&>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &info->select_list,&pPVar5->name);
      }
    }
  }
  if (*(long *)(in_RDX + 8) == 0) {
    TransformSelectNode((Transformer *)&target,(PGNode *)stmt,
                        SUB81(*(undefined8 *)(in_RDX + 0x10),0));
    oVar2 = target;
    target.ptr = (PGResTarget *)0x0;
    _Var1._M_head_impl =
         (info->select_statement).
         super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
         super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
         super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl;
    (info->select_statement).
    super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
    super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
    super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl = (QueryNode *)oVar2.ptr;
    if (_Var1._M_head_impl == (QueryNode *)0x0) goto LAB_0135f548;
    (**(code **)((long)(_Var1._M_head_impl)->_vptr_QueryNode + 8))();
  }
  else {
    TransformRangeVar((Transformer *)&target,(PGRangeVar *)stmt);
    this_00 = unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>::operator->
                        ((unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>
                          *)&target);
    TableRef::Cast<duckdb::BaseTableRef>(this_00);
    ::std::__cxx11::string::_M_assign((string *)&info->table);
    ::std::__cxx11::string::_M_assign((string *)&info->schema);
    ::std::__cxx11::string::_M_assign((string *)&info->catalog);
  }
  if (target.ptr != (PGResTarget *)0x0) {
    (**(code **)(*(long *)target.ptr + 8))();
  }
LAB_0135f548:
  TransformCopyOptions((Transformer *)stmt,info,*(PGList **)(in_RDX + 0x30));
  return (unique_ptr<duckdb::CopyStatement,_std::default_delete<duckdb::CopyStatement>_>)
         (_Tuple_impl<0UL,_duckdb::CopyStatement_*,_std::default_delete<duckdb::CopyStatement>_>)
         local_b0._M_t.
         super__Tuple_impl<0UL,_duckdb::CopyStatement_*,_std::default_delete<duckdb::CopyStatement>_>
         .super__Head_base<0UL,_duckdb::CopyStatement_*,_false>._M_head_impl;
}

Assistant:

unique_ptr<CopyStatement> Transformer::TransformCopy(duckdb_libpgquery::PGCopyStmt &stmt) {
	auto result = make_uniq<CopyStatement>();
	auto &info = *result->info;

	// get file_path and is_from
	info.is_from = stmt.is_from;
	if (!stmt.filename) {
		// stdin/stdout
		info.file_path = info.is_from ? "/dev/stdin" : "/dev/stdout";
	} else {
		// copy to a file
		info.file_path = stmt.filename;
	}

	if (ReplacementScan::CanReplace(info.file_path, {"parquet"})) {
		info.format = "parquet";
	} else if (ReplacementScan::CanReplace(info.file_path, {"json", "jsonl", "ndjson"})) {
		info.format = "json";
	} else {
		info.format = "csv";
	}

	// get select_list
	if (stmt.attlist) {
		for (auto n = stmt.attlist->head; n != nullptr; n = n->next) {
			auto target = PGPointerCast<duckdb_libpgquery::PGResTarget>(n->data.ptr_value);
			if (target->name) {
				info.select_list.emplace_back(target->name);
			}
		}
	}

	if (stmt.relation) {
		auto ref = TransformRangeVar(*stmt.relation);
		auto &table = ref->Cast<BaseTableRef>();
		info.table = table.table_name;
		info.schema = table.schema_name;
		info.catalog = table.catalog_name;
	} else {
		info.select_statement = TransformSelectNode(*stmt.query);
	}

	// handle the different options of the COPY statement
	TransformCopyOptions(info, stmt.options);

	return result;
}